

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O1

vector<duckdb::MetadataHandle,_true> * __thiscall
duckdb::SingleFileBlockManager::GetFreeListBlocks
          (vector<duckdb::MetadataHandle,_true> *__return_storage_ptr__,SingleFileBlockManager *this
          )

{
  size_type sVar1;
  size_type sVar2;
  size_t sVar3;
  MetadataManager *pMVar4;
  idx_t iVar5;
  idx_t iVar6;
  ulong uVar7;
  MetadataHandle free_list_handle;
  MetadataHandle local_50;
  
  (__return_storage_ptr__->
  super_vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>).
  super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>).
  super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>).
  super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar4 = BlockManager::GetMetadataManager(&this->super_BlockManager);
  iVar5 = MetadataManager::GetMetadataBlockSize(pMVar4);
  uVar7 = 0;
  while( true ) {
    sVar1 = (this->multi_use_blocks)._M_h._M_element_count;
    sVar2 = (this->modified_blocks)._M_h._M_element_count;
    sVar3 = (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pMVar4 = BlockManager::GetMetadataManager(&this->super_BlockManager);
    iVar6 = MetadataManager::BlockCount(pMVar4);
    if (iVar6 * 0x10 + sVar1 * 0xc + (sVar2 + sVar3) * 8 + 0x18 < uVar7) break;
    pMVar4 = BlockManager::GetMetadataManager(&this->super_BlockManager);
    MetadataManager::AllocateHandle(&local_50,pMVar4);
    ::std::vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>::
    emplace_back<duckdb::MetadataHandle>
              (&__return_storage_ptr__->
                super_vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>,
               &local_50);
    uVar7 = (iVar5 - 8) + uVar7;
    BufferHandle::~BufferHandle(&local_50.handle);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<MetadataHandle> SingleFileBlockManager::GetFreeListBlocks() {
	vector<MetadataHandle> free_list_blocks;
	auto &metadata_manager = GetMetadataManager();

	// reserve all blocks that we are going to write the free list to
	// since these blocks are no longer free we cannot just include them in the free list!
	auto block_size = metadata_manager.GetMetadataBlockSize() - sizeof(idx_t);
	idx_t allocated_size = 0;
	while (true) {
		auto free_list_size = sizeof(uint64_t) + sizeof(block_id_t) * (free_list.size() + modified_blocks.size());
		auto multi_use_blocks_size =
		    sizeof(uint64_t) + (sizeof(block_id_t) + sizeof(uint32_t)) * multi_use_blocks.size();
		auto metadata_blocks =
		    sizeof(uint64_t) + (sizeof(block_id_t) + sizeof(idx_t)) * GetMetadataManager().BlockCount();
		auto total_size = free_list_size + multi_use_blocks_size + metadata_blocks;
		if (total_size < allocated_size) {
			break;
		}
		auto free_list_handle = GetMetadataManager().AllocateHandle();
		free_list_blocks.push_back(std::move(free_list_handle));
		allocated_size += block_size;
	}

	return free_list_blocks;
}